

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O1

void __thiscall QMainWindowLayout::revert(QMainWindowLayout *this,QLayoutItem *widgetItem)

{
  QMainWindowLayoutState *this_00;
  QToolBarAreaLayout *this_01;
  QArrayDataPointer<int> *this_02;
  QMainWindowLayout *pQVar1;
  QArrayDataPointer<QDockAreaLayoutItem> *this_03;
  QToolBarAreaLayoutLine *pQVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  QDockAreaLayoutItem *pQVar6;
  Representation RVar7;
  int iVar8;
  undefined4 extraout_var;
  long lVar9;
  QArrayDataPointer<QToolBarAreaLayoutLine> *other;
  long in_FS_OFFSET;
  QRect QVar10;
  QArrayDataPointer<int> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(int *)(this + 0x3c0) <= *(int *)(this + 0x3c8)) &&
     (*(int *)(this + 0x3c4) <= *(int *)(this + 0x3cc))) {
    iVar8 = (*widgetItem->_vptr_QLayoutItem[0xd])(widgetItem);
    this_00 = (QMainWindowLayoutState *)(this + 0x88);
    *(undefined8 *)(this + 0x88) = *(undefined8 *)(this + 0x3c0);
    *(undefined8 *)(this + 0x90) = *(undefined8 *)(this + 0x3c8);
    *(undefined8 *)(this + 0x98) = *(undefined8 *)(this + 0x3d0);
    this_01 = (QToolBarAreaLayout *)(this + 0xa0);
    *(undefined8 *)(this + 0xa0) = *(undefined8 *)(this + 0x3d8);
    *(undefined8 *)(this + 0xa8) = *(undefined8 *)(this + 0x3e0);
    *(undefined8 *)(this + 0xb0) = *(undefined8 *)(this + 1000);
    other = (QArrayDataPointer<QToolBarAreaLayoutLine> *)(this + 0x3f0);
    lVar9 = 4;
    do {
      QArrayDataPointer<QToolBarAreaLayoutLine>::operator=
                ((QArrayDataPointer<QToolBarAreaLayoutLine> *)&other[-0x23].size,other);
      pQVar2 = other[1].ptr;
      uVar3 = *(undefined8 *)((long)&other[1].ptr + 1);
      uVar4 = *(undefined8 *)((long)&other[1].size + 1);
      other[-0x22].size = (qsizetype)other[1].d;
      other[-0x21].d = (Data *)pQVar2;
      *(undefined8 *)((long)&other[-0x21].d + 1) = uVar3;
      *(undefined8 *)((long)&other[-0x21].ptr + 1) = uVar4;
      other = (QArrayDataPointer<QToolBarAreaLayoutLine> *)&other[2].ptr;
      lVar9 = lVar9 + -1;
    } while (lVar9 != 0);
    this[0x198] = this[0x4d0];
    *(undefined8 *)(this + 0x1a0) = *(undefined8 *)(this + 0x4d8);
    *(undefined8 *)(this + 0x1a8) = *(undefined8 *)(this + 0x4e0);
    *(undefined8 *)(this + 0x1b0) = *(undefined8 *)(this + 0x4e8);
    *(undefined8 *)(this + 0x1b8) = *(undefined8 *)(this + 0x4f0);
    *(undefined8 *)(this + 0x1c0) = *(undefined8 *)(this + 0x4f8);
    *(undefined8 *)(this + 0x1c8) = *(undefined8 *)(this + 0x500);
    *(undefined8 *)(this + 0x1d0) = *(undefined8 *)(this + 0x508);
    *(undefined8 *)(this + 0x1d8) = *(undefined8 *)(this + 0x510);
    lVar9 = 0x1e0;
    do {
      pQVar1 = this + lVar9;
      *(undefined8 *)pQVar1 = *(undefined8 *)(pQVar1 + 0x338);
      QArrayDataPointer<QWidget_*>::operator=
                ((QArrayDataPointer<QWidget_*> *)(pQVar1 + 8),
                 (QArrayDataPointer<QWidget_*> *)(this + lVar9 + 0x340));
      uVar3 = *(undefined8 *)(this + lVar9 + 0x360);
      uVar4 = *(undefined8 *)(this + lVar9 + 0x368);
      uVar5 = *(undefined8 *)(this + lVar9 + 0x370);
      *(undefined8 *)(pQVar1 + 0x20) = *(undefined8 *)(this + lVar9 + 0x358);
      *(undefined8 *)(pQVar1 + 0x28) = uVar3;
      *(undefined8 *)(pQVar1 + 0x30) = uVar4;
      *(undefined8 *)(pQVar1 + 0x38) = uVar5;
      this_03 = (QArrayDataPointer<QDockAreaLayoutItem> *)(this + lVar9 + 0x40);
      QArrayDataPointer<QDockAreaLayoutItem>::operator=
                (this_03,(QArrayDataPointer<QDockAreaLayoutItem> *)(this + lVar9 + 0x378));
      pQVar6 = *(QDockAreaLayoutItem **)(this + lVar9 + 0x398);
      this_03[1].d = *(Data **)(this + lVar9 + 0x390);
      this_03[1].ptr = pQVar6;
      *(undefined4 *)&this_03[1].size = *(undefined4 *)(this + lVar9 + 0x3a0);
      lVar9 = lVar9 + 0x70;
    } while (lVar9 != 0x3a0);
    this[0x3a4] = this[0x6dc];
    *(undefined4 *)(this + 0x3a0) = *(undefined4 *)(this + 0x6d8);
    QArrayDataPointer<QWidget_*>::operator=
              ((QArrayDataPointer<QWidget_*> *)(this + 0x3a8),
               (QArrayDataPointer<QWidget_*> *)(this + 0x6e0));
    QMainWindowLayoutState::indexOf
              ((QList<int> *)&local_50,this_00,(QWidget *)CONCAT44(extraout_var,iVar8));
    this_02 = (QArrayDataPointer<int> *)(this + 0x7b0);
    QArrayDataPointer<int>::operator=(this_02,&local_50);
    if (&(local_50.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d)->super_QArrayData,4,0x10);
      }
    }
    if (*(long *)(this + 0x7c0) != 0) {
      fixToolBarOrientation(widgetItem,*(int *)(*(long *)(this + 0x7b8) + 4));
      QMainWindowLayoutState::unplug(this_00,(QList<int> *)this_02,(QMainWindowLayoutState *)0x0);
      RVar7.m_i = (this_00->rect).y1.m_i;
      uVar3 = *(undefined8 *)(this + 0x90);
      (this_01->rect).x1 = (Representation)(this_00->rect).x1.m_i;
      (this_01->rect).y1 = (Representation)RVar7.m_i;
      *(undefined8 *)(this + 0xa8) = uVar3;
      QVar10 = QToolBarAreaLayout::fitLayout(this_01);
      *(QRect *)(this + 0x1b0) = QVar10;
      QDockAreaLayout::fitLayout((QDockAreaLayout *)(this + 0x1a0));
      QVar10 = QMainWindowLayoutState::itemRect(this_00,(QList<int> *)this_02);
      *(QRect *)(this + 0x7c8) = QVar10;
      plug(this,widgetItem);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMainWindowLayout::revert(QLayoutItem *widgetItem)
{
    if (!savedState.isValid())
        return;

    QWidget *widget = widgetItem->widget();
    layoutState = savedState;
    currentGapPos = layoutState.indexOf(widget);
    if (currentGapPos.isEmpty())
        return;
    fixToolBarOrientation(widgetItem, currentGapPos.at(1));
    layoutState.unplug(currentGapPos);
    layoutState.fitLayout();
    currentGapRect = layoutState.itemRect(currentGapPos);

    plug(widgetItem);
}